

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.cpp
# Opt level: O0

void __thiscall
sfc::Map::add(Map *this,Image *image,Tileset *tileset,Palette *palette,uint bpp,uint pos_x,
             uint pos_y)

{
  string_view fmt;
  string_view fmt_00;
  FILE *pFVar1;
  bool bVar2;
  uint uVar3;
  size_type sVar4;
  runtime_error *this_00;
  reference ppSVar5;
  reference pvVar6;
  vector<sfc::Tile,_std::allocator<sfc::Tile>_> *this_01;
  const_reference this_02;
  Mapentry local_39c;
  TileFlipped local_38e;
  undefined1 auStack_38c [6];
  TileFlipped flipped;
  bool local_384;
  bool bStack_383;
  undefined1 local_380 [8];
  char *local_378;
  undefined1 local_370 [12];
  Mapentry local_364;
  undefined1 local_358 [8];
  char *local_350;
  anon_union_16_16_d721ec3a_for_value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_1
  local_348;
  undefined1 local_338 [8];
  Tile remapped_tile;
  Image remapped_image;
  Subpalette **p;
  const_iterator __end2;
  const_iterator __begin2;
  vector<const_sfc::Subpalette_*,_std::allocator<const_sfc::Subpalette_*>_> *__range2;
  vector<const_sfc::Subpalette_*,_std::allocator<const_sfc::Subpalette_*>_> spv;
  Tile matched_tile;
  uint local_1c0;
  int palette_index;
  int tileset_index;
  uint pos_x_local;
  uint bpp_local;
  Palette *palette_local;
  Tileset *tileset_local;
  Image *image_local;
  Map *this_local;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_unsigned_int>
  *local_180;
  char *local_178;
  uint *local_170;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_unsigned_int>
  local_168;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_unsigned_int>
  *local_148;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_unsigned_int>
  *vargs_1;
  v10 *local_138;
  FILE *local_130;
  char *local_128;
  uint *puStack_120;
  format_args local_118;
  char *local_108;
  uint *local_100;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_unsigned_int>
  local_f8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_unsigned_int>
  *local_d0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_unsigned_int>
  *vargs;
  v10 *local_c0;
  FILE *local_b8;
  char *local_b0;
  uint *puStack_a8;
  char **local_a0;
  char *local_98;
  uint *puStack_90;
  char **local_80;
  char *local_78;
  uint *puStack_70;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_unsigned_int>
  *local_68;
  format_args *local_60;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_unsigned_int>
  *local_58;
  Map **local_50;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_unsigned_int>
  *local_48;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_unsigned_int>
  *local_40;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_unsigned_int>
  *local_38;
  undefined8 local_30;
  Map **local_28;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_unsigned_int>
  *local_20;
  undefined8 local_18;
  format_args *local_10;
  
  uVar3 = this->_map_width;
  sVar4 = std::vector<sfc::Mapentry,_std::allocator<sfc::Mapentry>_>::size(&this->_entries);
  if (sVar4 < pos_y * uVar3 + pos_x) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Map entry out of bounds");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_1c0 = 0xffffffff;
  matched_tile._palette.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0xffffffff;
  Tile::Tile((Tile *)&spv.
                      super__Vector_base<const_sfc::Subpalette_*,_std::allocator<const_sfc::Subpalette_*>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  Palette::subpalettes_matching
            ((vector<const_sfc::Subpalette_*,_std::allocator<const_sfc::Subpalette_*>_> *)&__range2,
             palette,image);
  __end2 = std::vector<const_sfc::Subpalette_*,_std::allocator<const_sfc::Subpalette_*>_>::begin
                     ((vector<const_sfc::Subpalette_*,_std::allocator<const_sfc::Subpalette_*>_> *)
                      &__range2);
  p = (Subpalette **)
      std::vector<const_sfc::Subpalette_*,_std::allocator<const_sfc::Subpalette_*>_>::end
                ((vector<const_sfc::Subpalette_*,_std::allocator<const_sfc::Subpalette_*>_> *)
                 &__range2);
  while (bVar2 = __gnu_cxx::
                 operator==<const_sfc::Subpalette_*const_*,_std::vector<const_sfc::Subpalette_*,_std::allocator<const_sfc::Subpalette_*>_>_>
                           (&__end2,(__normal_iterator<const_sfc::Subpalette_*const_*,_std::vector<const_sfc::Subpalette_*,_std::allocator<const_sfc::Subpalette_*>_>_>
                                     *)&p), ((bVar2 ^ 0xffU) & 1) != 0) {
    ppSVar5 = __gnu_cxx::
              __normal_iterator<const_sfc::Subpalette_*const_*,_std::vector<const_sfc::Subpalette_*,_std::allocator<const_sfc::Subpalette_*>_>_>
              ::operator*(&__end2);
    Image::Image((Image *)&remapped_tile._palette.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,image,*ppSVar5);
    Tile::Tile((Tile *)local_338,
               (Image *)&remapped_tile._palette.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,this->_mode,bpp,true);
    local_1c0 = Tileset::index_of(tileset,(Tile *)local_338);
    if (local_1c0 == 0xffffffff) {
      local_348.int128_value._12_4_ = 0;
    }
    else {
      matched_tile._palette.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = Palette::index_of(palette,*ppSVar5);
      Tile::operator=((Tile *)&spv.
                               super__Vector_base<const_sfc::Subpalette_*,_std::allocator<const_sfc::Subpalette_*>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,(Tile *)local_338)
      ;
      local_348.int128_value._12_4_ = 2;
    }
    Tile::~Tile((Tile *)local_338);
    Image::~Image((Image *)&remapped_tile._palette.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
    if (local_348.int128_value._12_4_ != 0) break;
    __gnu_cxx::
    __normal_iterator<const_sfc::Subpalette_*const_*,_std::vector<const_sfc::Subpalette_*,_std::allocator<const_sfc::Subpalette_*>_>_>
    ::operator++(&__end2);
  }
  std::vector<const_sfc::Subpalette_*,_std::allocator<const_sfc::Subpalette_*>_>::~vector
            ((vector<const_sfc::Subpalette_*,_std::allocator<const_sfc::Subpalette_*>_> *)&__range2)
  ;
  pFVar1 = _stderr;
  if (local_1c0 == 0xffffffff) {
    local_350 = "  No matching tile for position {},{}\n";
    local_348.long_long_value = 0x26;
    local_358._4_4_ = Image::src_coord_x(image);
    local_358._0_4_ = Image::src_coord_y(image);
    local_b0 = local_350;
    puStack_a8 = (uint *)local_348.long_long_value;
    local_b8 = pFVar1;
    local_c0 = (v10 *)(local_358 + 4);
    vargs = (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_unsigned_int>
             *)local_358;
    ::fmt::v10::
    make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,unsigned_int,unsigned_int>
              (&local_f8,local_c0,(uint *)vargs,(uint *)local_348.string.data);
    local_d0 = &local_f8;
    local_a0 = &local_b0;
    local_108 = local_b0;
    local_100 = puStack_a8;
    local_60 = &local_118;
    local_18 = 0x22;
    local_118.desc_ = 0x22;
    local_118.field_1.values_ =
         (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_d0;
    fmt_00.size_ = (size_t)puStack_a8;
    fmt_00.data_ = local_b0;
    local_98 = local_108;
    puStack_90 = local_100;
    local_68 = local_d0;
    local_40 = local_d0;
    local_20 = local_d0;
    local_10 = local_60;
    ::fmt::v10::vprint(local_b8,fmt_00,local_118);
    Mapentry::Mapentry((Mapentry *)(local_370 + 0xc),0,0,false,false);
    pvVar6 = std::vector<sfc::Mapentry,_std::allocator<sfc::Mapentry>_>::operator[]
                       (&this->_entries,(ulong)(pos_y * this->_map_width + pos_x));
    pvVar6->tile_index = local_364.tile_index;
    pvVar6->palette_index = local_364.palette_index;
    pvVar6->flip_h = local_364.flip_h;
    pvVar6->flip_v = local_364.flip_v;
  }
  else {
    uVar3 = max_tile_count_for_mode(this->_mode);
    pFVar1 = _stderr;
    if ((int)local_1c0 < (int)uVar3) {
      this_01 = Tileset::tiles(tileset);
      this_02 = std::vector<sfc::Tile,_std::allocator<sfc::Tile>_>::operator[]
                          (this_01,(long)(int)local_1c0);
      local_38e = Tile::is_flipped(this_02,(Tile *)&spv.
                                                  super__Vector_base<const_sfc::Subpalette_*,_std::allocator<const_sfc::Subpalette_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                  );
      Mapentry::Mapentry(&local_39c,local_1c0,
                         matched_tile._palette.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage._4_4_,(bool)(local_38e.h & 1),
                         (bool)(local_38e.v & 1));
      pvVar6 = std::vector<sfc::Mapentry,_std::allocator<sfc::Mapentry>_>::operator[]
                         (&this->_entries,(ulong)(pos_y * this->_map_width + pos_x));
      pvVar6->tile_index = local_39c.tile_index;
      pvVar6->palette_index = local_39c.palette_index;
      pvVar6->flip_h = local_39c.flip_h;
      pvVar6->flip_v = local_39c.flip_v;
    }
    else {
      local_378 = "  Mapped tile exceeds allowed map index at position {},{}\n";
      local_370._0_8_ = (uint *)0x3a;
      local_380._4_4_ = Image::src_coord_x(image);
      local_380._0_4_ = Image::src_coord_y(image);
      local_128 = local_378;
      puStack_120 = (uint *)local_370._0_8_;
      local_130 = pFVar1;
      local_138 = (v10 *)(local_380 + 4);
      vargs_1 = (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_unsigned_int>
                 *)local_380;
      ::fmt::v10::
      make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,unsigned_int,unsigned_int>
                (&local_168,local_138,(uint *)vargs_1,(uint *)local_370._0_8_);
      local_148 = &local_168;
      local_80 = &local_128;
      local_178 = local_128;
      local_170 = puStack_120;
      local_50 = &this_local;
      local_30 = 0x22;
      this_local = (Map *)0x22;
      local_180 = local_148;
      fmt.size_ = (size_t)puStack_120;
      fmt.data_ = local_128;
      local_78 = local_178;
      puStack_70 = local_170;
      local_58 = local_148;
      local_48 = local_148;
      local_38 = local_148;
      local_28 = local_50;
      ::fmt::v10::vprint(local_130,fmt,_this_local);
      Mapentry::Mapentry((Mapentry *)auStack_38c,0,0,false,false);
      pvVar6 = std::vector<sfc::Mapentry,_std::allocator<sfc::Mapentry>_>::operator[]
                         (&this->_entries,(ulong)(pos_y * this->_map_width + pos_x));
      pvVar6->tile_index = auStack_38c._0_4_;
      pvVar6->palette_index = stack0xfffffffffffffc78;
      pvVar6->flip_h = local_384;
      pvVar6->flip_v = bStack_383;
    }
  }
  Tile::~Tile((Tile *)&spv.
                       super__Vector_base<const_sfc::Subpalette_*,_std::allocator<const_sfc::Subpalette_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void Map::add(const sfc::Image& image, const sfc::Tileset& tileset, const sfc::Palette& palette, unsigned bpp, unsigned pos_x, unsigned pos_y) {
  if (((pos_y * _map_width) + pos_x) > _entries.size())
    throw std::runtime_error("Map entry out of bounds");

  int tileset_index = -1;
  int palette_index = -1;
  Tile matched_tile;
  {
    // search all viable palette mappings of image in tileset
    const auto spv = palette.subpalettes_matching(image);
    for (const auto& p : spv) {
      const Image remapped_image = Image(image, *p);
      Tile remapped_tile(remapped_image, _mode, bpp, true);
      tileset_index = tileset.index_of(remapped_tile);
      if (tileset_index != -1) {
        palette_index = palette.index_of(*p);
        matched_tile = remapped_tile;
        break;
      }
    }
  }

  if (tileset_index == -1) {
    fmt::print(stderr, "  No matching tile for position {},{}\n", image.src_coord_x(), image.src_coord_y());
    _entries[(pos_y * _map_width) + pos_x] = Mapentry(0, 0, false, false);

  } else if (tileset_index >= (int)max_tile_count_for_mode(_mode)) {
    fmt::print(stderr, "  Mapped tile exceeds allowed map index at position {},{}\n", image.src_coord_x(), image.src_coord_y());
    _entries[(pos_y * _map_width) + pos_x] = Mapentry(0, 0, false, false);

  } else {
    const TileFlipped flipped = tileset.tiles()[tileset_index].is_flipped(matched_tile);
    _entries[(pos_y * _map_width) + pos_x] =
      Mapentry(tileset_index, palette_index, flipped.h, flipped.v);
  }
}